

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# train.c
# Opt level: O2

void read_problem(char *filename)

{
  feature_node **ppfVar1;
  FILE *__stream;
  char *pcVar2;
  feature_node *pfVar3;
  char *__nptr;
  char *__nptr_00;
  int *piVar4;
  ushort **ppuVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  char *endptr;
  double local_48;
  long local_40;
  FILE *local_38;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    prob.l = 0;
    max_line_len = 0x400;
    line = (char *)malloc(0x400);
    lVar10 = 0;
    while (pcVar2 = readline((FILE *)__stream), pcVar2 != (char *)0x0) {
      strtok(line," \t");
      do {
        lVar10 = lVar10 + 1;
        pcVar2 = strtok((char *)0x0," \t");
        if (pcVar2 == (char *)0x0) break;
      } while (*pcVar2 != '\n');
      prob.l = prob.l + 1;
    }
    rewind(__stream);
    local_48 = bias;
    prob.bias = bias;
    uVar12 = (ulong)prob.l;
    filename = (char *)(uVar12 * 8);
    prob.y = (double *)malloc((size_t)filename);
    prob.x = (feature_node **)malloc((size_t)filename);
    pfVar3 = (feature_node *)malloc((lVar10 + uVar12) * 0x10);
    uVar11 = 0;
    lVar10 = 0;
    iVar7 = 0;
    x_space = pfVar3;
    local_38 = __stream;
    while( true ) {
      ppfVar1 = prob.x;
      if ((long)(int)uVar12 <= (long)uVar11) {
        prob.n = iVar7;
        if (0.0 <= local_48) {
          iVar7 = iVar7 + 1;
          prob.n = iVar7;
          for (lVar6 = 1; lVar6 < (int)uVar12; lVar6 = lVar6 + 1) {
            ppfVar1[lVar6][-2].index = iVar7;
          }
          pfVar3[lVar10 + -2].index = iVar7;
        }
        fclose(local_38);
        return;
      }
      readline((FILE *)local_38);
      prob.x[uVar11] = x_space + lVar10;
      local_40 = lVar10;
      pcVar2 = strtok(line," \t\n");
      uVar12 = uVar11;
      if (pcVar2 == (char *)0x0) break;
      local_48 = (double)CONCAT44(local_48._4_4_,iVar7);
      dVar13 = strtod(pcVar2,&endptr);
      prob.y[uVar11] = dVar13;
      iVar7 = (int)uVar11;
      if ((endptr == pcVar2) || (*endptr != '\0')) {
LAB_00102c6a:
        exit_input_error(0x1b9,iVar7 + 1);
        filename = pcVar2;
        break;
      }
      uVar8 = lVar10 * 0x10 | 8;
      uVar12 = 0;
      while( true ) {
        __nptr = strtok((char *)0x0,":");
        __nptr_00 = strtok((char *)0x0," \t");
        pfVar3 = x_space;
        iVar9 = (int)uVar12;
        if (__nptr_00 == (char *)0x0) break;
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar2 = (char *)strtol(__nptr,&endptr,10);
        *(int *)((long)x_space + (uVar8 - 8)) = (int)pcVar2;
        if ((int)pcVar2 <= iVar9) {
LAB_00102c47:
          printf("Error: column index must be ordered : x_space[j].index(%d) inst_max_index(%d)\n",
                 (ulong)pcVar2 & 0xffffffff,uVar12 & 0xffffffff);
          exit_input_error(0x1c8,iVar7 + 1);
          goto LAB_00102c6a;
        }
        if (((endptr == __nptr) || (*piVar4 != 0)) || (*endptr != '\0')) {
          exit_input_error(0x1ca,iVar7 + 1);
LAB_00102c37:
          exit_input_error(0x1d2,iVar7 + 1);
          goto LAB_00102c47;
        }
        *piVar4 = 0;
        dVar13 = strtod(__nptr_00,&endptr);
        *(double *)((long)&x_space->index + uVar8) = dVar13;
        if (((endptr == __nptr_00) || (*piVar4 != 0)) ||
           ((uVar12 = (ulong)*endptr, uVar12 != 0 &&
            (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + uVar12 * 2 + 1) & 0x20) == 0))))
        goto LAB_00102c37;
        local_40 = local_40 + 1;
        uVar8 = uVar8 + 0x10;
        uVar12 = (ulong)pcVar2 & 0xffffffff;
      }
      iVar7 = local_48._0_4_;
      if (local_48._0_4_ < iVar9) {
        iVar7 = iVar9;
      }
      local_48 = prob.bias;
      lVar6 = local_40;
      if (0.0 <= prob.bias) {
        *(double *)((long)&x_space->index + uVar8) = prob.bias;
        lVar6 = local_40 + 1;
      }
      lVar10 = lVar6 + 1;
      pfVar3[lVar6].index = -1;
      uVar11 = uVar11 + 1;
      uVar12 = (ulong)(uint)prob.l;
      filename = pcVar2;
    }
    exit_input_error(0x1b4,(int)uVar12 + 1);
  }
  fprintf(_stderr,"can\'t open input file %s\n",filename);
  exit(1);
}

Assistant:

void read_problem(const char *filename)
{
	int max_index, inst_max_index, i;
	size_t elements, j;
	FILE *fp = fopen(filename,"r");
	char *endptr;
	char *idx, *val, *label;

	if(fp == NULL)
	{
		fprintf(stderr,"can't open input file %s\n",filename);
		exit(1);
	}

	prob.l = 0;
	elements = 0;
	max_line_len = 1024;
	line = Malloc(char,max_line_len);
	while(readline(fp)!=NULL)
	{
		char *p = strtok(line," \t"); // label

		// features
		while(1)
		{
			p = strtok(NULL," \t");
			if(p == NULL || *p == '\n') // check '\n' as ' ' may be after the last feature
				break;
			elements++;
		}
		elements++; // for bias term
		prob.l++;
	}
	rewind(fp);

	prob.bias=bias;

	prob.y = Malloc(double,prob.l);
	prob.x = Malloc(struct feature_node *,prob.l);
	x_space = Malloc(struct feature_node,elements+prob.l);

	max_index = 0;
	j=0;
	for(i=0;i<prob.l;i++)
	{
		inst_max_index = 0; // strtol gives 0 if wrong format
		readline(fp);
		prob.x[i] = &x_space[j];
		label = strtok(line," \t\n");
		if(label == NULL) { // empty line
			exit_input_error(__LINE__, i+1);
		}

		prob.y[i] = strtod(label,&endptr);
		if(endptr == label || *endptr != '\0') {
			exit_input_error(__LINE__, i+1);
		}

		while(1)
		{
			idx = strtok(NULL,":");
			val = strtok(NULL," \t");

			if(val == NULL)
				break;

			errno = 0;
			x_space[j].index = (int) strtol(idx,&endptr,10);
			if(x_space[j].index <= inst_max_index) {
				printf("Error: column index must be ordered : x_space[j].index(%d) inst_max_index(%d)\n", x_space[j].index, inst_max_index) ;
				exit_input_error(__LINE__, i+1);
			} else if(endptr == idx || errno != 0 || *endptr != '\0') {
				exit_input_error(__LINE__, i+1);
			}
			else
				inst_max_index = x_space[j].index;

			errno = 0;
			x_space[j].value = strtod(val,&endptr);
			if(endptr == val || errno != 0 || (*endptr != '\0' && !isspace(*endptr))) {
				exit_input_error(__LINE__, i+1);
			}

			++j;
		}

		if(inst_max_index > max_index)
			max_index = inst_max_index;

		if(prob.bias >= 0)
			x_space[j++].value = prob.bias;

		x_space[j++].index = -1;
	}

	if(prob.bias >= 0)
	{
		prob.n=max_index+1;
		for(i=1;i<prob.l;i++)
			(prob.x[i]-2)->index = prob.n;
		x_space[j-2].index = prob.n;
	}
	else
		prob.n=max_index;

	fclose(fp);
}